

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorisedJoin.cpp
# Opt level: O0

void __thiscall FactorisedJoin::~FactorisedJoin(FactorisedJoin *this)

{
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *pvVar1;
  Engine *in_RDI;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_00;
  
  in_RDI->_vptr_Engine = (_func_int **)&PTR__FactorisedJoin_001f0c80;
  pvVar1 = (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
           in_RDI[6]._vptr_Engine;
  if (pvVar1 != (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x0) {
    for (this_00 = pvVar1 + (long)pvVar1[-1].
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pvVar1 != this_00; this_00 = this_00 + -1) {
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector(this_00);
    }
    operator_delete__(&pvVar1[-1].
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  unordered_map<std::vector<double,_std::allocator<double>_>,_node::Union_*,_std::hash<std::vector<double,_std::allocator<double>_>_>,_std::equal_to<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>_>_>
  ::~unordered_map((unordered_map<std::vector<double,_std::allocator<double>_>,_node::Union_*,_std::hash<std::vector<double,_std::allocator<double>_>_>,_std::equal_to<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>_>_>
                    *)0x1b7c45);
  std::shared_ptr<DataHandler>::~shared_ptr((shared_ptr<DataHandler> *)0x1b7c53);
  std::shared_ptr<DTree>::~shared_ptr((shared_ptr<DTree> *)0x1b7c61);
  Engine::~Engine(in_RDI);
  return;
}

Assistant:

FactorisedJoin::~FactorisedJoin()
{
    delete[] _ids;
}